

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::PointerGate1<float>::equals(PointerGate1<float> *this,QObject<float> *other)

{
  QGate1<float> *pQVar1;
  QGate1<float> *other_00;
  PointerGate1<float> *local_40;
  G *p;
  QObject<float> *other_local;
  PointerGate1<float> *this_local;
  
  if (other == (QObject<float> *)0x0) {
    local_40 = (PointerGate1<float> *)0x0;
  }
  else {
    local_40 = (PointerGate1<float> *)__dynamic_cast(other,&QObject<float>::typeinfo,&typeinfo,0);
  }
  if (local_40 == (PointerGate1<float> *)0x0) {
    pQVar1 = ptr(this);
    this_local._7_1_ = QObject<float>::operator==(other,&pQVar1->super_QObject<float>);
  }
  else {
    pQVar1 = ptr(local_40);
    other_00 = ptr(this);
    this_local._7_1_ =
         QObject<float>::operator==(&pQVar1->super_QObject<float>,&other_00->super_QObject<float>);
  }
  return this_local._7_1_;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate1< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }